

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::PythonGenerator::GetDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,FieldDef *field)

{
  BaseType BVar1;
  bool bVar2;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  BVar1 = (field->value).type.base_type;
  if ((BVar1 - BASE_TYPE_UTYPE < 0xc) && (field->presence == kOptional)) {
    __s = "None";
    __a = &local_9;
  }
  else if (BVar1 == BASE_TYPE_BOOL) {
    bVar2 = std::operator==(&(field->value).constant,"0");
    __s = "True";
    if (bVar2) {
      __s = "False";
    }
    __a = &local_a;
  }
  else {
    if (BVar1 - BASE_TYPE_FLOAT < 2) {
      FloatConstantGenerator::GenFloatConstant_abi_cxx11_
                (__return_storage_ptr__,&(this->float_const_gen_).super_FloatConstantGenerator,field
                );
      return __return_storage_ptr__;
    }
    if (BVar1 - BASE_TYPE_UTYPE < 10) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(string *)&(field->value).constant);
      return __return_storage_ptr__;
    }
    __s = "None";
    __a = &local_b;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string GetDefaultValue(const FieldDef &field) const {
    BaseType base_type = field.value.type.base_type;
    if (field.IsScalarOptional()) {
      return "None";
    } else if (IsBool(base_type)) {
      return field.value.constant == "0" ? "False" : "True";
    } else if (IsFloat(base_type)) {
      return float_const_gen_.GenFloatConstant(field);
    } else if (IsInteger(base_type)) {
      return field.value.constant;
    } else {
      // For string, struct, and table.
      return "None";
    }
  }